

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

saint_t inverse_bw_transform(sauchar_t *T,sauchar_t *U,saidx_t *A,saidx_t n,saidx_t idx)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  saidx_t *__ptr;
  ulong uVar4;
  long lVar5;
  int iVar6;
  saint_t sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  sauchar_t D [256];
  saidx_t C [256];
  byte abStack_538 [256];
  int local_438 [258];
  
  sVar7 = -1;
  if (((((idx <= n) && (T != (sauchar_t *)0x0)) && (U != (sauchar_t *)0x0)) &&
      ((-1 < (idx | n) && (n < 1 || idx != 0)))) && (sVar7 = 0, 1 < n)) {
    __ptr = A;
    if ((A == (saidx_t *)0x0) &&
       (__ptr = (saidx_t *)malloc((ulong)(uint)n << 2), __ptr == (saidx_t *)0x0)) {
      sVar7 = -2;
    }
    else {
      uVar8 = 0;
      memset(local_438,0,0x400);
      uVar4 = 1;
      if (1 < n) {
        uVar4 = (ulong)(uint)n;
      }
      do {
        local_438[T[uVar8]] = local_438[T[uVar8]] + 1;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
      lVar5 = 0;
      uVar3 = 0;
      iVar6 = 0;
      do {
        iVar2 = local_438[lVar5];
        if (0 < iVar2) {
          local_438[lVar5] = iVar6;
          lVar12 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          abStack_538[lVar12] = (byte)lVar5;
          iVar6 = iVar6 + iVar2;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x100);
      if (idx < 1) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        do {
          iVar6 = local_438[T[uVar4]];
          local_438[T[uVar4]] = iVar6 + 1;
          __ptr[iVar6] = (saidx_t)uVar4;
          uVar4 = uVar4 + 1;
        } while ((uint)idx != uVar4);
      }
      if ((int)uVar4 < n) {
        uVar4 = uVar4 & 0xffffffff;
        do {
          pbVar1 = T + uVar4;
          uVar4 = uVar4 + 1;
          iVar6 = local_438[*pbVar1];
          local_438[*pbVar1] = iVar6 + 1;
          __ptr[iVar6] = (saidx_t)uVar4;
        } while ((uint)n != uVar4);
      }
      if (0 < (int)uVar3) {
        uVar4 = 0;
        do {
          local_438[uVar4] = local_438[abStack_538[uVar4]];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      uVar4 = 1;
      if (1 < n) {
        uVar4 = (ulong)(uint)n;
      }
      uVar8 = 0;
      do {
        if ((int)uVar3 < 1) {
          lVar5 = 0;
        }
        else {
          iVar6 = 0;
          uVar10 = uVar3;
          do {
            uVar9 = uVar10 >> 1;
            iVar11 = uVar9 + iVar6;
            iVar2 = uVar9 + 1 + iVar6;
            if (idx <= local_438[iVar11]) {
              iVar2 = iVar6;
            }
            iVar6 = iVar2;
            uVar13 = (uint)(local_438[iVar11] < idx) & ~uVar10;
            uVar10 = uVar9 - uVar13;
          } while (uVar10 != 0 && uVar13 <= uVar9);
          lVar5 = (long)iVar6;
        }
        U[uVar8] = abStack_538[lVar5];
        idx = __ptr[(long)idx + -1];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar4);
      sVar7 = 0;
      if (A == (saidx_t *)0x0) {
        free(__ptr);
      }
    }
  }
  return sVar7;
}

Assistant:

saint_t
inverse_bw_transform(const sauchar_t *T, sauchar_t *U, saidx_t *A,
                     saidx_t n, saidx_t idx) {
  saidx_t C[ALPHABET_SIZE];
  sauchar_t D[ALPHABET_SIZE];
  saidx_t *B;
  saidx_t i, p;
  saint_t c, d;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0) || (idx < 0) ||
     (n < idx) || ((0 < n) && (idx == 0))) {
    return -1;
  }
  if(n <= 1) { return 0; }

  if((B = A) == NULL) {
    /* Allocate n*sizeof(saidx_t) bytes of memory. */
    if((B = (saidx_t *)malloc((size_t)n * sizeof(saidx_t))) == NULL) { return -2; }
  }

  /* Inverse BW transform. */
  for(c = 0; c < ALPHABET_SIZE; ++c) { C[c] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(c = 0, d = 0, i = 0; c < ALPHABET_SIZE; ++c) {
    p = C[c];
    if(0 < p) {
      C[c] = i;
      D[d++] = (sauchar_t)c;
      i += p;
    }
  }
  for(i = 0; i < idx; ++i) { B[C[T[i]]++] = i; }
  for( ; i < n; ++i)       { B[C[T[i]]++] = i + 1; }
  for(c = 0; c < d; ++c) { C[c] = C[D[c]]; }
  for(i = 0, p = idx; i < n; ++i) {
    U[i] = D[binarysearch_lower(C, d, p)];
    p = B[p - 1];
  }

  if(A == NULL) {
    /* Deallocate memory. */
    free(B);
  }

  return 0;
}